

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

AppendResult __thiscall
metaf::WeatherGroup::append
          (WeatherGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  Type TVar2;
  Qualifier QVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  WeatherPhenomena *pWVar4;
  WeatherGroup *in_RDI;
  optional<metaf::WeatherPhenomena> wp;
  AppendResult local_4;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (ulong)in_RDI->incompleteText;
  switch(__lhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
  default:
    TVar2 = type(in_RDI);
    if ((TVar2 == CURRENT) || (TVar2 = type(in_RDI), TVar2 == RECENT)) {
      parseWeatherWithoutEvent
                ((string *)
                 wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._12_8_,
                 wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._8_4_);
      bVar1 = std::optional<metaf::WeatherPhenomena>::has_value
                        ((optional<metaf::WeatherPhenomena> *)0x247b02);
      if (bVar1) {
        TVar2 = type(in_RDI);
        if (TVar2 == CURRENT) {
          pWVar4 = std::optional<metaf::WeatherPhenomena>::operator->
                             ((optional<metaf::WeatherPhenomena> *)0x247b23);
          QVar3 = WeatherPhenomena::qualifier(pWVar4);
          if (QVar3 == RECENT) {
            return NOT_APPENDED;
          }
        }
        TVar2 = type(in_RDI);
        if (TVar2 == RECENT) {
          pWVar4 = std::optional<metaf::WeatherPhenomena>::operator->
                             ((optional<metaf::WeatherPhenomena> *)0x247b52);
          QVar3 = WeatherPhenomena::qualifier(pWVar4);
          if (QVar3 != RECENT) {
            return NOT_APPENDED;
          }
        }
        pWVar4 = std::optional<metaf::WeatherPhenomena>::operator*
                           ((optional<metaf::WeatherPhenomena> *)0x247b73);
        bVar1 = addWeatherPhenomena(in_RDI,pWVar4);
        if (bVar1) {
          local_4 = APPENDED;
        }
        else {
          local_4 = NOT_APPENDED;
        }
      }
      else {
        local_4 = NOT_APPENDED;
      }
    }
    else {
      local_4 = NOT_APPENDED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    bVar1 = std::operator!=(__lhs,(char *)in_RDI);
    if (bVar1) {
      local_4 = GROUP_INVALIDATED;
    }
    else {
      in_RDI->incompleteText = NONE;
      local_4 = APPENDED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    bVar1 = std::operator!=(__lhs,(char *)in_RDI);
    if (bVar1) {
      local_4 = GROUP_INVALIDATED;
    }
    else {
      in_RDI->incompleteText = TSLTNG_TEMPO;
      local_4 = APPENDED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    bVar1 = std::operator!=(__lhs,(char *)in_RDI);
    if (bVar1) {
      local_4 = GROUP_INVALIDATED;
    }
    else {
      in_RDI->incompleteText = NONE;
      local_4 = APPENDED;
    }
  }
  return local_4;
}

Assistant:

AppendResult WeatherGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	switch (incompleteText) {
		case IncompleteText::NONE:
		break;

		case IncompleteText::WX:
		if (group != "MISG") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE; 
		return AppendResult::APPENDED;

		case IncompleteText::TSLTNG:
		if (group != "TEMPO") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::TSLTNG_TEMPO; 
		return AppendResult::APPENDED;

		case IncompleteText::TSLTNG_TEMPO:
		if (group != "UNAVBL") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::APPENDED;
	}

	if (type() != Type::CURRENT && type() != Type::RECENT)
		return AppendResult::NOT_APPENDED;

	const auto wp = parseWeatherWithoutEvent(group, reportPart);
	if (wp.has_value()) {
		// Recent weather cannot be appended to current weather and vice versa
		if (type() == Type::CURRENT && 
			wp->qualifier() == WeatherPhenomena::Qualifier::RECENT) return AppendResult::NOT_APPENDED;
		if (type() == Type::RECENT && 
			wp->qualifier() != WeatherPhenomena::Qualifier::RECENT) return AppendResult::NOT_APPENDED;

		if (!addWeatherPhenomena(*wp)) return AppendResult::NOT_APPENDED;
		return AppendResult::APPENDED;
	}
	return AppendResult::NOT_APPENDED;
}